

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O3

bool __thiscall
crnlib::rg_etc1::etc1_optimizer::evaluate_solution
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 aVar4;
  params *ppVar5;
  color_quad_u8 *pcVar6;
  uint uVar7;
  uint uVar8;
  undefined8 uVar9;
  uint s;
  uint uVar10;
  long lVar11;
  component_t cVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  uint8 uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  undefined4 *puVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  bool bVar29;
  byte local_b8 [3];
  component_t cStack_b5;
  byte local_b4;
  byte local_b3;
  byte local_b2;
  byte local_b0;
  byte local_af;
  byte local_ae;
  byte local_ac;
  byte local_ab;
  byte local_aa;
  color_quad_u8 block_colors [4];
  
  trial_solution->m_valid = false;
  ppVar5 = this->m_pParams;
  bVar1 = (coords->m_unscaled_color).field_0.field_0.r;
  uVar21 = (uint)bVar1;
  if (ppVar5->m_constrain_against_base_color5 == true) {
    iVar14 = uVar21 - (ppVar5->m_base_color5).field_0.field_0.r;
    iVar20 = (uint)(coords->m_unscaled_color).field_0.field_0.g -
             (uint)(ppVar5->m_base_color5).field_0.field_0.g;
    iVar22 = (uint)(coords->m_unscaled_color).field_0.field_0.b -
             (uint)(ppVar5->m_base_color5).field_0.field_0.b;
    iVar17 = iVar20;
    if (iVar14 < iVar20) {
      iVar17 = iVar14;
    }
    if (iVar22 <= iVar17) {
      iVar17 = iVar22;
    }
    if (iVar17 < -4) {
      return false;
    }
    if (iVar20 < iVar14) {
      iVar20 = iVar14;
    }
    if (iVar20 <= iVar22) {
      iVar20 = iVar22;
    }
    if (3 < iVar20) {
      return false;
    }
  }
  if (coords->m_color4 == true) {
    uVar21 = uVar21 << 4 | uVar21;
    uVar19 = (uint)(coords->m_unscaled_color).field_0.field_0.g;
    uVar19 = uVar19 << 4 | uVar19;
    uVar23 = (uint)(coords->m_unscaled_color).field_0.field_0.b;
    uVar23 = uVar23 << 4 | uVar23;
  }
  else {
    uVar21 = uVar21 << 3 | (uint)(bVar1 >> 2);
    bVar1 = (coords->m_unscaled_color).field_0.field_0.g;
    uVar19 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
    bVar1 = (coords->m_unscaled_color).field_0.field_0.b;
    uVar23 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
  }
  if (0xfe < uVar21) {
    uVar21 = 0xff;
  }
  if (0xfe < uVar19) {
    uVar19 = 0xff;
  }
  if (0xfe < uVar23) {
    uVar23 = 0xff;
  }
  trial_solution->m_error = 0xffffffffffffffff;
  puVar24 = &g_etc1_inten_tables;
  lVar15 = 0;
  do {
    lVar11 = 0;
    do {
      iVar17 = puVar24[lVar11];
      iVar20 = iVar17 + uVar21;
      iVar14 = iVar17 + uVar19;
      if (iVar20 < 1) {
        iVar20 = 0;
      }
      if (0xfe < iVar20) {
        iVar20 = 0xff;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      if (0xfe < iVar14) {
        iVar14 = 0xff;
      }
      block_colors[lVar11 + -0xe].field_0.field_0.r = (component_t)iVar20;
      iVar20 = iVar17 + uVar23;
      if ((int)(iVar17 + uVar23) < 1) {
        iVar20 = 0;
      }
      block_colors[lVar11 + -0xe].field_0.field_0.g = (component_t)iVar14;
      cVar12 = (component_t)iVar20;
      if (0xfe < iVar20) {
        cVar12 = 0xff;
      }
      block_colors[lVar11 + -0xe].field_0.field_0.b = cVar12;
      block_colors[lVar11 + -0xe].field_0.field_0.a = '\0';
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    pcVar6 = this->m_pParams->m_pSrc_pixels;
    uVar25 = 0;
    uVar26 = 0;
    do {
      bVar1 = pcVar6[uVar26].field_0.field_0.r;
      uVar18 = (uint)bVar1;
      bVar2 = pcVar6[uVar26].field_0.field_0.g;
      iVar17 = (uint)bVar2 - (uint)local_b8[1];
      bVar3 = pcVar6[uVar26].field_0.field_0.b;
      iVar20 = (uint)bVar3 - (uint)local_b8[2];
      uVar27 = iVar20 * iVar20 + iVar17 * iVar17 + (uVar18 - local_b8[0]) * (uVar18 - local_b8[0]);
      iVar17 = (uint)bVar1 - (uint)local_b4;
      iVar14 = (uint)bVar2 - (uint)local_b3;
      iVar20 = (uint)bVar3 - (uint)local_b2;
      uVar10 = iVar20 * iVar20 + iVar14 * iVar14 + iVar17 * iVar17;
      uVar7 = uVar10;
      if (uVar10 >= uVar27) {
        uVar7 = uVar27;
      }
      iVar17 = (uint)bVar3 - (uint)local_ae;
      uVar28 = iVar17 * iVar17 +
               ((uint)bVar2 - (uint)local_af) * ((uint)bVar2 - (uint)local_af) +
               (uVar18 - local_b0) * (uVar18 - local_b0);
      uVar8 = uVar28;
      if (uVar7 <= uVar28) {
        uVar8 = uVar7;
      }
      uVar16 = uVar10 < uVar27;
      if (uVar7 > uVar28) {
        uVar16 = '\x02';
      }
      iVar17 = (uint)bVar3 - (uint)local_aa;
      uVar10 = iVar17 * iVar17 +
               ((uint)bVar2 - (uint)local_ab) * ((uint)bVar2 - (uint)local_ab) +
               (uVar18 - local_ac) * (uVar18 - local_ac);
      uVar7 = uVar10;
      if (uVar8 <= uVar10) {
        uVar7 = uVar8;
      }
      if (uVar8 > uVar10) {
        uVar16 = '\x03';
      }
      this->m_temp_selectors[uVar26] = uVar16;
      uVar25 = uVar7 + uVar25;
      uVar13 = trial_solution->m_error;
    } while ((uVar25 < uVar13) && (bVar29 = uVar26 < 7, uVar26 = uVar26 + 1, bVar29));
    if (uVar25 < uVar13) {
      trial_solution->m_error = uVar25;
      (trial_solution->m_coords).m_inten_table = (uint)lVar15;
      *(undefined8 *)trial_solution->m_selectors = *(undefined8 *)this->m_temp_selectors;
      trial_solution->m_valid = true;
      uVar13 = uVar25;
    }
    lVar15 = lVar15 + 1;
    puVar24 = puVar24 + 4;
  } while (lVar15 != 8);
  aVar4 = (coords->m_unscaled_color).field_0;
  (trial_solution->m_coords).m_unscaled_color.field_0 = aVar4;
  (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
  if ((pBest_solution != (potential_solution *)0x0) && (uVar13 < pBest_solution->m_error)) {
    (pBest_solution->m_coords).m_unscaled_color.field_0 = aVar4;
    (pBest_solution->m_coords).m_inten_table = (trial_solution->m_coords).m_inten_table;
    (pBest_solution->m_coords).m_color4 = (trial_solution->m_coords).m_color4;
    uVar9 = *(undefined8 *)&trial_solution->field_0x14;
    *(undefined8 *)pBest_solution->m_selectors = *(undefined8 *)trial_solution->m_selectors;
    *(undefined8 *)&pBest_solution->field_0x14 = uVar9;
    *(undefined8 *)((long)&pBest_solution->m_error + 1) =
         *(undefined8 *)((long)&trial_solution->m_error + 1);
    return true;
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution) {
  trial_solution.m_valid = false;

  if (m_pParams->m_constrain_against_base_color5) {
    const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
    const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
    const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

    if ((rg_etc1::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (rg_etc1::maximum(dr, dg, db) > cETC1ColorDeltaMax))
      return false;
  }

  const color_quad_u8 base_color(coords.get_scaled_color());

  const uint n = 8;

  trial_solution.m_error = cUINT64_MAX;

  for (uint inten_table = 0; inten_table < cETC1IntenModifierValues; inten_table++) {
    const int* pInten_table = g_etc1_inten_tables[inten_table];

    color_quad_u8 block_colors[4];
    for (uint s = 0; s < 4; s++) {
      const int yd = pInten_table[s];
      block_colors[s].set(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
    }

    uint64 total_error = 0;

    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    for (uint c = 0; c < n; c++) {
      const color_quad_u8& src_pixel = *pSrc_pixels++;

      uint best_selector_index = 0;
      uint best_error = rg_etc1::square(src_pixel.r - block_colors[0].r) + rg_etc1::square(src_pixel.g - block_colors[0].g) + rg_etc1::square(src_pixel.b - block_colors[0].b);

      uint trial_error = rg_etc1::square(src_pixel.r - block_colors[1].r) + rg_etc1::square(src_pixel.g - block_colors[1].g) + rg_etc1::square(src_pixel.b - block_colors[1].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 1;
      }

      trial_error = rg_etc1::square(src_pixel.r - block_colors[2].r) + rg_etc1::square(src_pixel.g - block_colors[2].g) + rg_etc1::square(src_pixel.b - block_colors[2].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 2;
      }

      trial_error = rg_etc1::square(src_pixel.r - block_colors[3].r) + rg_etc1::square(src_pixel.g - block_colors[3].g) + rg_etc1::square(src_pixel.b - block_colors[3].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 3;
      }

      m_temp_selectors[c] = static_cast<uint8>(best_selector_index);

      total_error += best_error;
      if (total_error >= trial_solution.m_error)
        break;
    }

    if (total_error < trial_solution.m_error) {
      trial_solution.m_error = total_error;
      trial_solution.m_coords.m_inten_table = inten_table;
      memcpy(trial_solution.m_selectors, m_temp_selectors, 8);
      trial_solution.m_valid = true;
    }
  }
  trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
  trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

  bool success = false;
  if (pBest_solution) {
    if (trial_solution.m_error < pBest_solution->m_error) {
      *pBest_solution = trial_solution;
      success = true;
    }
  }

  return success;
}